

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::stencilOpSeparate
          (ReferenceContext *this,deUint32 face,deUint32 sfail,deUint32 dpfail,deUint32 dppass)

{
  bool bVar1;
  deBool dVar2;
  bool local_39;
  bool local_29;
  int local_28;
  int type;
  bool setBack;
  bool setFront;
  deUint32 dppass_local;
  deUint32 dpfail_local;
  deUint32 sfail_local;
  deUint32 face_local;
  ReferenceContext *this_local;
  
  local_29 = face == 0x404 || face == 0x408;
  local_39 = face == 0x405 || face == 0x408;
  while (((bVar1 = isValidStencilOp(sfail), bVar1 && (bVar1 = isValidStencilOp(dpfail), bVar1)) &&
         (bVar1 = isValidStencilOp(dppass), bVar1))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      while ((local_29 || (local_39))) {
        dVar2 = ::deGetFalse();
        if (dVar2 == 0) {
          for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
            if (((local_28 == 0) && (local_29)) || ((local_28 == 1 && (local_39)))) {
              this->m_stencil[local_28].opStencilFail = sfail;
              this->m_stencil[local_28].opDepthFail = dpfail;
              this->m_stencil[local_28].opDepthPass = dppass;
            }
          }
          return;
        }
      }
      setError(this,0x500);
      return;
    }
  }
  setError(this,0x500);
  return;
}

Assistant:

void ReferenceContext::stencilOpSeparate (deUint32 face, deUint32 sfail, deUint32 dpfail, deUint32 dppass)
{
	const bool	setFront	= face == GL_FRONT || face == GL_FRONT_AND_BACK;
	const bool	setBack		= face == GL_BACK || face == GL_FRONT_AND_BACK;

	RC_IF_ERROR(!isValidStencilOp(sfail)	||
				!isValidStencilOp(dpfail)	||
				!isValidStencilOp(dppass),
				GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(!setFront && !setBack, GL_INVALID_ENUM, RC_RET_VOID);

	for (int type = 0; type < rr::FACETYPE_LAST; ++type)
	{
		if ((type == rr::FACETYPE_FRONT && setFront) ||
			(type == rr::FACETYPE_BACK && setBack))
		{
			m_stencil[type].opStencilFail	= sfail;
			m_stencil[type].opDepthFail		= dpfail;
			m_stencil[type].opDepthPass		= dppass;
		}
	}
}